

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon_label.c
# Opt level: O2

void JPCommonLabel_make(JPCommonLabel *label)

{
  _JPCommonLabelAccentPhrase *p_Var1;
  JPCommonLabelAccentPhrase *pJVar2;
  JPCommonLabelAccentPhrase *pJVar3;
  JPCommonLabelBreathGroup *b;
  JPCommonLabelMora *m;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  JPCommonLabelPhoneme *pJVar12;
  char **ppcVar13;
  void *pvVar14;
  undefined8 *__ptr;
  undefined8 *puVar15;
  _JPCommonLabelWord *p_Var16;
  _JPCommonLabelBreathGroup *p_Var17;
  _JPCommonLabelWord *p_Var18;
  _JPCommonLabelWord **pp_Var19;
  _JPCommonLabelAccentPhrase **pp_Var20;
  JPCommonLabelPhoneme **ppJVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  JPCommonLabelPhoneme **ppJVar27;
  char *pcVar28;
  char *pcVar29;
  uint uVar30;
  long lVar31;
  ulong uVar32;
  size_t __nmemb;
  size_t __nmemb_00;
  ulong uVar33;
  bool bVar34;
  char buff [1024];
  
  ppJVar27 = &label->phoneme_head;
  pJVar12 = label->phoneme_head;
  label->size = 0;
  __nmemb_00 = 6;
  for (; pJVar12 != (JPCommonLabelPhoneme *)0x0; pJVar12 = pJVar12->next) {
    label->size = (int)__nmemb_00 + -5;
    __nmemb_00 = __nmemb_00 + 1;
  }
  if ((int)__nmemb_00 == 6) {
    fwrite("WARNING: JPCommonLabel_make() in jcomon_label.c: No phoneme.\n",0x3d,1,_stderr);
    return;
  }
  lVar23 = __nmemb_00 - 4;
  __nmemb = __nmemb_00 - 4;
  label->size = (int)__nmemb;
  ppcVar13 = (char **)calloc(__nmemb,8);
  label->feature = ppcVar13;
  lVar31 = 0;
  while (bVar34 = lVar23 != 0, lVar23 = lVar23 + -1, bVar34) {
    pvVar14 = calloc(0x400,1);
    *(void **)((long)label->feature + lVar31) = pvVar14;
    lVar31 = lVar31 + 8;
  }
  __ptr = (undefined8 *)calloc(__nmemb_00,8);
  pcVar28 = "xx";
  *__ptr = "xx";
  __ptr[1] = "xx";
  __ptr[2] = "sil";
  __ptr[__nmemb_00 - 3] = "sil";
  __ptr[__nmemb_00 - 2] = "xx";
  __ptr[__nmemb_00 - 1] = "xx";
  puVar15 = __ptr + 3;
  ppJVar21 = ppJVar27;
  while (pJVar12 = *ppJVar21, pJVar12 != (JPCommonLabelPhoneme *)0x0) {
    *puVar15 = pJVar12->phoneme;
    puVar15 = puVar15 + 1;
    ppJVar21 = &pJVar12->next;
  }
  uVar25 = 0;
  do {
    pJVar12 = *ppJVar27;
    pcVar29 = pcVar28;
    do {
      uVar22 = uVar25;
      if ((long)(int)__nmemb <= (long)uVar22) {
        free(__ptr);
        return;
      }
      iVar4 = strcmp(pJVar12->phoneme,"pau");
      pcVar28 = (char *)__ptr[uVar22 + 1];
      sprintf(label->feature[uVar22],"%s^%s-%s+%s=%s",pcVar29,pcVar28,__ptr[uVar22 + 2],
              __ptr[uVar22 + 3],__ptr[uVar22 + 4]);
      if (((uVar22 == 0) || (iVar4 == 0)) || (uVar22 == label->size - 1)) {
        builtin_strncpy(buff,"/A:xx+xx+xx",0xb);
        buff._11_4_ = buff._11_4_ & 0xffffff00;
      }
      else {
        p_Var16 = (_JPCommonLabelWord *)pJVar12->up;
        p_Var1 = ((_JPCommonLabelWord *)p_Var16->tail)->up;
        p_Var18 = p_Var1->head;
        uVar30 = 0;
        do {
          p_Var18 = (_JPCommonLabelWord *)p_Var18->head;
          if (p_Var18 == (_JPCommonLabelWord *)0x0) break;
          uVar30 = uVar30 + 1;
        } while (p_Var18 != p_Var16);
        iVar5 = p_Var1->accent;
        if (iVar5 == 0) {
          iVar5 = count_mora_in_accent_phrase((JPCommonLabelMora *)p_Var16);
        }
        uVar6 = uVar30 - iVar5;
        if (0x30 < (int)(uVar30 - iVar5)) {
          uVar6 = 0x31;
        }
        uVar25 = (ulong)uVar6;
        if ((int)uVar6 < -0x30) {
          uVar25 = 0xffffffcf;
        }
        uVar6 = 0x31;
        if ((int)uVar30 < 0x31) {
          uVar6 = uVar30;
        }
        uVar33 = (ulong)uVar6;
        if ((int)uVar6 < 2) {
          uVar33 = 1;
        }
        iVar5 = count_mora_in_accent_phrase((JPCommonLabelMora *)p_Var16);
        iVar5 = iVar5 - uVar30;
        if (0x2f < iVar5) {
          iVar5 = 0x30;
        }
        if (iVar5 < 1) {
          iVar5 = 0;
        }
        sprintf(buff,"/A:%d+%d+%d",uVar25,uVar33,(ulong)(iVar5 + 1));
      }
      strcat(label->feature[uVar22],buff);
      if (iVar4 == 0) {
        p_Var16 = pJVar12->prev->up->up;
        if (p_Var16 != (_JPCommonLabelWord *)0x0) goto LAB_00174e29;
LAB_00174e48:
        builtin_strncpy(buff,"/B:xx-xx_xx",0xb);
        buff._11_4_ = buff._11_4_ & 0xffffff00;
      }
      else {
        p_Var18 = pJVar12->up->up;
        p_Var16 = p_Var18->prev;
        if (p_Var16 == (_JPCommonLabelWord *)0x0) goto LAB_00174e48;
        if (uVar22 == label->size - 1) {
          p_Var16 = p_Var18;
        }
LAB_00174e29:
        sprintf(buff,"/B:%s-%s_%s",p_Var16->pos,p_Var16->ctype,p_Var16->cform);
      }
      strcat(label->feature[uVar22],buff);
      if (((uVar22 == 0) || (iVar4 == 0)) || (uVar22 == label->size - 1)) {
        builtin_strncpy(buff,"/C:xx_xx+xx",0xb);
        buff._11_4_ = buff._11_4_ & 0xffffff00;
      }
      else {
        p_Var16 = pJVar12->up->up;
        sprintf(buff,"/C:%s_%s+%s",p_Var16->pos,p_Var16->ctype,p_Var16->cform);
      }
      strcat(label->feature[uVar22],buff);
      if (iVar4 == 0) {
        p_Var16 = pJVar12->next->up->up;
LAB_00174efe:
        if (p_Var16 == (_JPCommonLabelWord *)0x0) goto LAB_00174f22;
        sprintf(buff,"/D:%s+%s_%s",p_Var16->pos,p_Var16->ctype,p_Var16->cform);
      }
      else {
        p_Var16 = pJVar12->up->up;
        p_Var18 = p_Var16->next;
        if (uVar22 != 0) {
          p_Var16 = p_Var18;
        }
        if (p_Var18 != (_JPCommonLabelWord *)0x0) goto LAB_00174efe;
LAB_00174f22:
        builtin_strncpy(buff,"/D:xx+xx_xx",0xb);
        buff._11_4_ = buff._11_4_ & 0xffffff00;
      }
      strcat(label->feature[uVar22],buff);
      if (iVar4 == 0) {
        pp_Var19 = &pJVar12->prev->up->up;
        lVar23 = 0x40;
LAB_00174f79:
        pp_Var19 = (_JPCommonLabelWord **)((long)&(*pp_Var19)->pron + lVar23);
      }
      else {
        pp_Var19 = (_JPCommonLabelWord **)&pJVar12->up->up->up;
        lVar23 = 0x20;
        if (uVar22 != label->size - 1) goto LAB_00174f79;
      }
      p_Var1 = (_JPCommonLabelAccentPhrase *)*pp_Var19;
      if (p_Var1 == (_JPCommonLabelAccentPhrase *)0x0) {
        builtin_strncpy(buff,"/E:xx_xx!xx_xx",0xf);
      }
      else {
        uVar6 = count_mora_in_accent_phrase(p_Var1->head->head);
        uVar30 = 0x31;
        if ((int)uVar6 < 0x31) {
          uVar30 = uVar6;
        }
        uVar25 = (ulong)uVar30;
        if ((int)uVar30 < 2) {
          uVar25 = 1;
        }
        uVar30 = p_Var1->accent;
        if (p_Var1->accent == 0) {
          uVar30 = uVar6;
        }
        if (0x30 < (int)uVar30) {
          uVar30 = 0x31;
        }
        uVar33 = (ulong)uVar30;
        if ((int)uVar30 < 2) {
          uVar33 = 1;
        }
        pcVar29 = p_Var1->emotion;
        if (pcVar29 == (char *)0x0) {
          pcVar29 = "0";
        }
        sprintf(buff,"/E:%d_%d!%s_xx",uVar25,uVar33,pcVar29);
      }
      strcat(label->feature[uVar22],buff);
      if (((uVar22 == 0) || (p_Var1 == (_JPCommonLabelAccentPhrase *)0x0)) ||
         ((iVar4 == 0 || (uVar22 == label->size - 1)))) {
        builtin_strncpy(buff,"-xx",4);
      }
      else {
        iVar5 = strcmp(p_Var1->tail->tail->tail->next->phoneme,"pau");
        sprintf(buff,"-%d",(ulong)(iVar5 != 0));
      }
      strcat(label->feature[uVar22],buff);
      if ((((uVar22 == 0) || (iVar4 == 0)) || (uVar22 == label->size - 1)) ||
         (pJVar2 = pJVar12->up->up->up, pJVar2 == (JPCommonLabelAccentPhrase *)0x0)) {
        builtin_strncpy(buff + 0x13,"x|xx_xx",8);
        builtin_strncpy(buff,"/F:xx_xx#xx_xx@xx_x",0x13);
      }
      else {
        p_Var17 = pJVar2->up;
        uVar30 = 0;
        do {
          pJVar3 = p_Var17->head;
          if (pJVar3 == (JPCommonLabelAccentPhrase *)0x0) break;
          uVar30 = uVar30 + 1;
          p_Var17 = (_JPCommonLabelBreathGroup *)&pJVar3->next;
        } while (pJVar3 != pJVar2);
        p_Var16 = (_JPCommonLabelWord *)pJVar2->head->head;
        p_Var18 = ((_JPCommonLabelWord *)p_Var16->tail)->up->up->head->head;
        uVar6 = 0;
        do {
          p_Var18 = (_JPCommonLabelWord *)p_Var18->head;
          if (p_Var18 == (_JPCommonLabelWord *)0x0) break;
          uVar6 = uVar6 + 1;
        } while (p_Var18 != p_Var16);
        uVar7 = count_mora_in_accent_phrase((JPCommonLabelMora *)p_Var16);
        uVar9 = 0x31;
        if ((int)uVar7 < 0x31) {
          uVar9 = uVar7;
        }
        if ((int)uVar9 < 2) {
          uVar9 = 1;
        }
        uVar24 = pJVar2->accent;
        if (pJVar2->accent == 0) {
          uVar24 = uVar7;
        }
        if (0x30 < (int)uVar24) {
          uVar24 = 0x31;
        }
        uVar25 = (ulong)uVar24;
        if ((int)uVar24 < 2) {
          uVar25 = 1;
        }
        pcVar29 = pJVar2->emotion;
        if (pcVar29 == (char *)0x0) {
          pcVar29 = "0";
        }
        uVar7 = 0x31;
        if ((int)uVar30 < 0x31) {
          uVar7 = uVar30;
        }
        if ((int)uVar7 < 2) {
          uVar7 = 1;
        }
        iVar5 = count_accent_phrase_in_breath_group(pJVar2);
        iVar5 = iVar5 - uVar30;
        if (0x2f < iVar5) {
          iVar5 = 0x30;
        }
        if (iVar5 < 1) {
          iVar5 = 0;
        }
        uVar30 = 99;
        if ((int)uVar6 < 99) {
          uVar30 = uVar6;
        }
        uVar33 = (ulong)uVar30;
        if ((int)uVar30 < 2) {
          uVar33 = 1;
        }
        iVar8 = count_mora_in_breath_group((JPCommonLabelMora *)p_Var16);
        iVar8 = iVar8 - uVar6;
        if (0x61 < iVar8) {
          iVar8 = 0x62;
        }
        if (iVar8 < 1) {
          iVar8 = 0;
        }
        sprintf(buff,"/F:%d_%d#%s_xx@%d_%d|%d_%d",(ulong)uVar9,uVar25,pcVar29,uVar7,
                (ulong)(iVar5 + 1),uVar33,(ulong)(iVar8 + 1));
      }
      strcat(label->feature[uVar22],buff);
      if (iVar4 == 0) {
        pp_Var19 = &pJVar12->next->up->up;
        lVar23 = 0x40;
LAB_0017525d:
        pp_Var19 = (_JPCommonLabelWord **)((long)&(*pp_Var19)->pron + lVar23);
      }
      else {
        pp_Var19 = (_JPCommonLabelWord **)&pJVar12->up->up->up;
        lVar23 = 0x28;
        if (uVar22 != 0) goto LAB_0017525d;
      }
      p_Var1 = (_JPCommonLabelAccentPhrase *)*pp_Var19;
      if (p_Var1 == (_JPCommonLabelAccentPhrase *)0x0) {
        sprintf(buff,"/G:xx_xx%%xx_xx");
      }
      else {
        uVar6 = count_mora_in_accent_phrase(p_Var1->head->head);
        uVar30 = 0x31;
        if ((int)uVar6 < 0x31) {
          uVar30 = uVar6;
        }
        uVar25 = (ulong)uVar30;
        if ((int)uVar30 < 2) {
          uVar25 = 1;
        }
        uVar30 = p_Var1->accent;
        if (p_Var1->accent == 0) {
          uVar30 = uVar6;
        }
        if (0x30 < (int)uVar30) {
          uVar30 = 0x31;
        }
        uVar33 = (ulong)uVar30;
        if ((int)uVar30 < 2) {
          uVar33 = 1;
        }
        pcVar29 = p_Var1->emotion;
        if (pcVar29 == (char *)0x0) {
          pcVar29 = "0";
        }
        sprintf(buff,"/G:%d_%d%%%s_xx",uVar25,uVar33,pcVar29);
      }
      strcat(label->feature[uVar22],buff);
      if (((uVar22 == 0) || (p_Var1 == (_JPCommonLabelAccentPhrase *)0x0)) ||
         ((iVar4 == 0 || (uVar22 == label->size - 1)))) {
        builtin_strncpy(buff,"_xx",4);
      }
      else {
        iVar5 = strcmp(p_Var1->head->head->head->prev->phoneme,"pau");
        sprintf(buff,"_%d",(ulong)(iVar5 != 0));
      }
      strcat(label->feature[uVar22],buff);
      if (iVar4 == 0) {
        pp_Var20 = &pJVar12->prev->up->up->up;
        lVar23 = 0x30;
LAB_00175387:
        pp_Var20 = (_JPCommonLabelAccentPhrase **)((long)&(*pp_Var20)->accent + lVar23);
      }
      else {
        pp_Var20 = (_JPCommonLabelAccentPhrase **)&pJVar12->up->up->up->up;
        lVar23 = 0x10;
        if (uVar22 != label->size - 1) goto LAB_00175387;
      }
      if ((_JPCommonLabelBreathGroup *)*pp_Var20 == (_JPCommonLabelBreathGroup *)0x0) {
        builtin_strncpy(buff,"/H:xx_xx",9);
      }
      else {
        pJVar2 = ((_JPCommonLabelBreathGroup *)*pp_Var20)->head;
        uVar30 = count_accent_phrase_in_breath_group(pJVar2);
        if (0x30 < (int)uVar30) {
          uVar30 = 0x31;
        }
        uVar25 = (ulong)uVar30;
        if ((int)uVar30 < 2) {
          uVar25 = 1;
        }
        uVar30 = count_mora_in_breath_group(pJVar2->head->head);
        if (0x62 < (int)uVar30) {
          uVar30 = 99;
        }
        if ((int)uVar30 < 2) {
          uVar30 = 1;
        }
        sprintf(buff,"/H:%d_%d",uVar25,(ulong)uVar30);
      }
      strcat(label->feature[uVar22],buff);
      if (((uVar22 == 0) || (iVar4 == 0)) ||
         ((uVar22 == label->size - 1 ||
          (b = pJVar12->up->up->up->up, b == (JPCommonLabelBreathGroup *)0x0)))) {
        builtin_strncpy(buff + 0x13,"x|xx+xx",8);
        builtin_strncpy(buff,"/I:xx-xx@xx+xx&xx-x",0x13);
      }
      else {
        uVar30 = index_breath_group_in_utterance(b);
        pJVar2 = b->head;
        uVar6 = index_accent_phrase_in_utterance(pJVar2);
        m = pJVar2->head->head;
        uVar9 = index_mora_in_utterance(m);
        iVar5 = count_accent_phrase_in_breath_group(pJVar2);
        if (0x30 < iVar5) {
          iVar5 = 0x31;
        }
        if (iVar5 < 2) {
          iVar5 = 1;
        }
        uVar7 = count_mora_in_breath_group(m);
        if (0x62 < (int)uVar7) {
          uVar7 = 99;
        }
        uVar25 = (ulong)uVar7;
        if ((int)uVar7 < 2) {
          uVar25 = 1;
        }
        uVar7 = 0x13;
        if ((int)uVar30 < 0x13) {
          uVar7 = uVar30;
        }
        uVar33 = (ulong)uVar7;
        if ((int)uVar7 < 2) {
          uVar33 = 1;
        }
        iVar8 = count_breath_group_in_utterance(b);
        iVar8 = iVar8 - uVar30;
        if (0x11 < iVar8) {
          iVar8 = 0x12;
        }
        if (iVar8 < 1) {
          iVar8 = 0;
        }
        uVar30 = 0x31;
        if ((int)uVar6 < 0x31) {
          uVar30 = uVar6;
        }
        uVar26 = (ulong)uVar30;
        if ((int)uVar30 < 2) {
          uVar26 = 1;
        }
        iVar10 = count_accent_phrase_in_utterance(pJVar2);
        iVar10 = iVar10 - uVar6;
        if (0x2f < iVar10) {
          iVar10 = 0x30;
        }
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        uVar30 = 199;
        if ((int)uVar9 < 199) {
          uVar30 = uVar9;
        }
        uVar32 = (ulong)uVar30;
        if ((int)uVar30 < 2) {
          uVar32 = 1;
        }
        iVar11 = count_mora_in_utterance(m);
        iVar11 = iVar11 - uVar9;
        if (0xc5 < iVar11) {
          iVar11 = 0xc6;
        }
        if (iVar11 < 1) {
          iVar11 = 0;
        }
        sprintf(buff,"/I:%d-%d@%d+%d&%d-%d|%d+%d",iVar5,uVar25,uVar33,(ulong)(iVar8 + 1),uVar26,
                (ulong)(iVar10 + 1),uVar32,(ulong)(iVar11 + 1));
      }
      strcat(label->feature[uVar22],buff);
      if (iVar4 == 0) {
        pp_Var20 = &pJVar12->next->up->up->up;
        lVar23 = 0x30;
LAB_00175629:
        pp_Var20 = (_JPCommonLabelAccentPhrase **)((long)&(*pp_Var20)->accent + lVar23);
      }
      else {
        pp_Var20 = (_JPCommonLabelAccentPhrase **)&pJVar12->up->up->up->up;
        lVar23 = 0x18;
        if (uVar22 != 0) goto LAB_00175629;
      }
      if ((_JPCommonLabelBreathGroup *)*pp_Var20 == (_JPCommonLabelBreathGroup *)0x0) {
        builtin_strncpy(buff,"/J:xx_xx",9);
      }
      else {
        pJVar2 = ((_JPCommonLabelBreathGroup *)*pp_Var20)->head;
        uVar30 = count_accent_phrase_in_breath_group(pJVar2);
        if (0x30 < (int)uVar30) {
          uVar30 = 0x31;
        }
        uVar25 = (ulong)uVar30;
        if ((int)uVar30 < 2) {
          uVar25 = 1;
        }
        uVar30 = count_mora_in_breath_group(pJVar2->head->head);
        if (0x62 < (int)uVar30) {
          uVar30 = 99;
        }
        if ((int)uVar30 < 2) {
          uVar30 = 1;
        }
        sprintf(buff,"/J:%d_%d",uVar25,(ulong)uVar30);
      }
      uVar25 = uVar22 + 1;
      strcat(label->feature[uVar22],buff);
      uVar30 = count_breath_group_in_utterance(label->breath_head);
      if (0x12 < (int)uVar30) {
        uVar30 = 0x13;
      }
      uVar33 = (ulong)uVar30;
      if ((int)uVar30 < 2) {
        uVar33 = 1;
      }
      uVar30 = count_accent_phrase_in_utterance(label->accent_head);
      if (0x30 < (int)uVar30) {
        uVar30 = 0x31;
      }
      uVar26 = (ulong)uVar30;
      if ((int)uVar30 < 2) {
        uVar26 = 1;
      }
      uVar30 = count_mora_in_utterance(label->mora_head);
      if (0xc6 < (int)uVar30) {
        uVar30 = 199;
      }
      if ((int)uVar30 < 2) {
        uVar30 = 1;
      }
      sprintf(buff,"/K:%d+%d-%d",uVar33,uVar26,(ulong)uVar30);
      strcat(label->feature[uVar22],buff);
      __nmemb = (size_t)(uint)label->size;
      pcVar29 = pcVar28;
    } while ((uVar22 == 0) || ((long)label->size + -2 <= (long)uVar22));
    ppJVar27 = &pJVar12->next;
  } while( true );
}

Assistant:

void JPCommonLabel_make(JPCommonLabel * label)
{
   int i, tmp1, tmp2, tmp3;
   char buff[MAXBUFLEN];
   JPCommonLabelPhoneme *p;
   JPCommonLabelWord *w;
   JPCommonLabelAccentPhrase *a;
   JPCommonLabelBreathGroup *b;
   char **phoneme_list;
   int short_pause_flag;

   /* initialize */
   for (p = label->phoneme_head, label->size = 0; p != NULL; p = p->next)
      label->size++;
   if (label->size < 1) {
      fprintf(stderr, "WARNING: JPCommonLabel_make() in jcomon_label.c: No phoneme.\n");
      return;
   }
   label->size += 2;
   label->feature = (char **) calloc(label->size, sizeof(char *));
   for (i = 0; i < label->size; i++)
      label->feature[i] = (char *) calloc(MAXBUFLEN, sizeof(char));

   /* phoneme list */
   phoneme_list = (char **) calloc(label->size + 4, sizeof(char *));
   phoneme_list[0] = JPCOMMON_PHONEME_UNKNOWN;
   phoneme_list[1] = JPCOMMON_PHONEME_UNKNOWN;
   phoneme_list[2] = JPCOMMON_PHONEME_SILENT;
   phoneme_list[label->size + 1] = JPCOMMON_PHONEME_SILENT;
   phoneme_list[label->size + 2] = JPCOMMON_PHONEME_UNKNOWN;
   phoneme_list[label->size + 3] = JPCOMMON_PHONEME_UNKNOWN;
   for (i = 3, p = label->phoneme_head; p != NULL; p = p->next)
      phoneme_list[i++] = p->phoneme;

   for (i = 0, p = label->phoneme_head; i < label->size; i++) {
      if (strcmp(p->phoneme, JPCOMMON_PHONEME_SHORT_PAUSE) == 0)
         short_pause_flag = 1;
      else
         short_pause_flag = 0;

      /* for phoneme */
      sprintf(label->feature[i], "%s^%s-%s+%s=%s", phoneme_list[i], phoneme_list[i + 1],
              phoneme_list[i + 2], phoneme_list[i + 3], phoneme_list[i + 4]);
      /* for A: */
      if (i == 0 || i == label->size - 1 || short_pause_flag == 1)
         sprintf(buff, "/A:xx+xx+xx");
      else {
         tmp1 = index_mora_in_accent_phrase(p->up);
         tmp2 =
             p->up->up->up->accent ==
             0 ? count_mora_in_accent_phrase(p->up) : p->up->up->up->accent;
         sprintf(buff, "/A:%d+%d+%d", limit(tmp1 - tmp2, -MAX_M, MAX_M), limit(tmp1, 1, MAX_M),
                 limit(count_mora_in_accent_phrase(p->up) - tmp1 + 1, 1, MAX_M));
      }
      strcat(label->feature[i], buff);
      /* for B: */
      if (short_pause_flag == 1)
         w = p->prev->up->up;
      else if (p->up->up->prev == NULL)
         w = NULL;
      else if (i == label->size - 1)
         w = p->up->up;
      else
         w = p->up->up->prev;
      if (w == NULL)
         sprintf(buff, "/B:xx-xx_xx");
      else
         sprintf(buff, "/B:%s-%s_%s", w->pos, w->ctype, w->cform);
      strcat(label->feature[i], buff);
      /* for C: */
      if (i == 0 || i == label->size - 1 || short_pause_flag)
         sprintf(buff, "/C:xx_xx+xx");
      else
         sprintf(buff, "/C:%s_%s+%s", p->up->up->pos, p->up->up->ctype, p->up->up->cform);
      strcat(label->feature[i], buff);
      /* for D: */
      if (short_pause_flag == 1)
         w = p->next->up->up;
      else if (p->up->up->next == NULL)
         w = NULL;
      else if (i == 0)
         w = p->up->up;
      else
         w = p->up->up->next;
      if (w == NULL)
         sprintf(buff, "/D:xx+xx_xx");
      else
         sprintf(buff, "/D:%s+%s_%s", w->pos, w->ctype, w->cform);
      strcat(label->feature[i], buff);
      /* for E: */
      if (short_pause_flag == 1)
         a = p->prev->up->up->up;
      else if (i == label->size - 1)
         a = p->up->up->up;
      else
         a = p->up->up->up->prev;
      if (a == NULL)
         sprintf(buff, "/E:xx_xx!xx_xx");
      else
         sprintf(buff, "/E:%d_%d!%s_xx",
                 limit(count_mora_in_accent_phrase(a->head->head), 1, MAX_M),
                 limit(a->accent == 0 ? count_mora_in_accent_phrase(a->head->head) : a->accent, 1,
                       MAX_M), a->emotion == NULL ? "0" : a->emotion);
      strcat(label->feature[i], buff);
      if (i == 0 || i == label->size - 1 || short_pause_flag == 1 || a == NULL)
         sprintf(buff, "-xx");
      else
         sprintf(buff, "-%d",
                 strcmp(a->tail->tail->tail->next->phoneme,
                        JPCOMMON_PHONEME_SHORT_PAUSE) == 0 ? 0 : 1);
      strcat(label->feature[i], buff);
      /* for F: */
      if (i == 0 || i == label->size - 1 || short_pause_flag == 1)
         a = NULL;
      else
         a = p->up->up->up;
      if (a == NULL)
         sprintf(buff, "/F:xx_xx#xx_xx@xx_xx|xx_xx");
      else {
         tmp1 = index_accent_phrase_in_breath_group(a);
         tmp2 = index_mora_in_breath_group(a->head->head);
         sprintf(buff, "/F:%d_%d#%s_xx@%d_%d|%d_%d",
                 limit(count_mora_in_accent_phrase(a->head->head), 1, MAX_M),
                 limit(a->accent == 0 ? count_mora_in_accent_phrase(a->head->head) : a->accent, 1,
                       MAX_M), a->emotion == NULL ? "0" : a->emotion, limit(tmp1, 1, MAX_M),
                 limit(count_accent_phrase_in_breath_group(a) - tmp1 + 1, 1, MAX_M), limit(tmp2, 1,
                                                                                           MAX_L),
                 limit(count_mora_in_breath_group(a->head->head) - tmp2 + 1, 1, MAX_L));
      }
      strcat(label->feature[i], buff);
      /* for G: */
      if (short_pause_flag == 1)
         a = p->next->up->up->up;
      else if (i == 0)
         a = p->up->up->up;
      else
         a = p->up->up->up->next;
      if (a == NULL)
         sprintf(buff, "/G:xx_xx%%xx_xx");
      else
         sprintf(buff, "/G:%d_%d%%%s_xx",
                 limit(count_mora_in_accent_phrase(a->head->head), 1, MAX_M),
                 limit(a->accent == 0 ? count_mora_in_accent_phrase(a->head->head) : a->accent, 1,
                       MAX_M), a->emotion == NULL ? "0" : a->emotion);
      strcat(label->feature[i], buff);
      if (i == 0 || i == label->size - 1 || short_pause_flag == 1 || a == NULL)
         sprintf(buff, "_xx");
      else
         sprintf(buff, "_%d",
                 strcmp(a->head->head->head->prev->phoneme,
                        JPCOMMON_PHONEME_SHORT_PAUSE) == 0 ? 0 : 1);
      strcat(label->feature[i], buff);
      /* for H: */
      if (short_pause_flag == 1)
         b = p->prev->up->up->up->up;
      else if (i == label->size - 1)
         b = p->up->up->up->up;
      else
         b = p->up->up->up->up->prev;
      if (b == NULL)
         sprintf(buff, "/H:xx_xx");
      else
         sprintf(buff, "/H:%d_%d", limit(count_accent_phrase_in_breath_group(b->head), 1, MAX_M),
                 limit(count_mora_in_breath_group(b->head->head->head), 1, MAX_L));
      strcat(label->feature[i], buff);
      /* for I: */
      if (i == 0 || i == label->size - 1 || short_pause_flag == 1)
         b = NULL;
      else
         b = p->up->up->up->up;
      if (b == NULL)
         sprintf(buff, "/I:xx-xx@xx+xx&xx-xx|xx+xx");
      else {
         tmp1 = index_breath_group_in_utterance(b);
         tmp2 = index_accent_phrase_in_utterance(b->head);
         tmp3 = index_mora_in_utterance(b->head->head->head);
         sprintf(buff, "/I:%d-%d@%d+%d&%d-%d|%d+%d",
                 limit(count_accent_phrase_in_breath_group(b->head), 1, MAX_M),
                 limit(count_mora_in_breath_group(b->head->head->head), 1, MAX_L), limit(tmp1, 1,
                                                                                         MAX_S),
                 limit(count_breath_group_in_utterance(b) - tmp1 + 1, 1, MAX_S), limit(tmp2, 1,
                                                                                       MAX_M),
                 limit(count_accent_phrase_in_utterance(b->head) - tmp2 + 1, 1, MAX_M), limit(tmp3,
                                                                                              1,
                                                                                              MAX_LL),
                 limit(count_mora_in_utterance(b->head->head->head) - tmp3 + 1, 1, MAX_LL));
      }
      strcat(label->feature[i], buff);
      /* for J: */
      if (short_pause_flag == 1)
         b = p->next->up->up->up->up;
      else if (i == 0)
         b = p->up->up->up->up;
      else
         b = p->up->up->up->up->next;
      if (b == NULL)
         sprintf(buff, "/J:xx_xx");
      else
         sprintf(buff, "/J:%d_%d", limit(count_accent_phrase_in_breath_group(b->head), 1, MAX_M),
                 limit(count_mora_in_breath_group(b->head->head->head), 1, MAX_L));
      strcat(label->feature[i], buff);
      /* for K: */
      sprintf(buff, "/K:%d+%d-%d",
              limit(count_breath_group_in_utterance(label->breath_head), 1, MAX_S),
              limit(count_accent_phrase_in_utterance(label->accent_head), 1, MAX_M),
              limit(count_mora_in_utterance(label->mora_head), 1, MAX_LL));
      strcat(label->feature[i], buff);

      if (0 < i && i < label->size - 2)
         p = p->next;
   }

   /* free */
   free(phoneme_list);
}